

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::bindBuffer(ReferenceContext *this,deUint32 target,deUint32 buffer)

{
  bool bVar1;
  deBool dVar2;
  DataBuffer *local_20;
  DataBuffer *bufObj;
  deUint32 buffer_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  do {
    bVar1 = isValidBufferTarget(target);
    if (!bVar1) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  local_20 = (DataBuffer *)0x0;
  if ((buffer != 0) &&
     (local_20 = rc::ObjectManager<sglr::rc::DataBuffer>::find(&this->m_buffers,buffer),
     local_20 == (DataBuffer *)0x0)) {
    local_20 = (DataBuffer *)operator_new(0x28);
    rc::DataBuffer::DataBuffer(local_20,buffer);
    rc::ObjectManager<sglr::rc::DataBuffer>::insert(&this->m_buffers,local_20);
  }
  setBufferBinding(this,target,local_20);
  return;
}

Assistant:

void ReferenceContext::bindBuffer (deUint32 target, deUint32 buffer)
{
	RC_IF_ERROR(!isValidBufferTarget(target), GL_INVALID_ENUM, RC_RET_VOID);

	rc::DataBuffer*	bufObj	= DE_NULL;

	if (buffer != 0)
	{
		bufObj = m_buffers.find(buffer);
		if (!bufObj)
		{
			bufObj = new DataBuffer(buffer);
			m_buffers.insert(bufObj);
		}
	}

	setBufferBinding(target, bufObj);
}